

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::WriteHighLevelDirectives
          (cmGlobalGhsMultiGenerator *this,cmLocalGenerator *root,ostream *fout)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ostream *poVar5;
  string *psVar6;
  cmGlobalGhsMultiGenerator *this_00;
  size_t sVar7;
  cmLocalGenerator *this_01;
  string tgt;
  string local_a0;
  char *local_80;
  char *local_78;
  char local_70;
  undefined7 uStack_6f;
  cmLocalGenerator *local_60;
  ostream *local_58;
  string local_50;
  
  local_80 = &local_70;
  local_78 = (char *)0x0;
  local_70 = '\0';
  pcVar2 = (this->super_cmGlobalGenerator).CMakeInstance;
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  local_60 = root;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"GHS_PRIMARY_TARGET","");
  pcVar4 = cmake::GetCacheDefinition(pcVar2,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pcVar3 = local_78;
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    pcVar2 = (this->super_cmGlobalGenerator).CMakeInstance;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"CMAKE_GENERATOR_PLATFORM","");
    pcVar4 = cmake::GetCacheDefinition(pcVar2,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmGlobalGenerator).CMakeInstance;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"GHS_TARGET_PLATFORM","");
    local_58 = fout;
    cmake::GetCacheDefinition(pcVar2,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = local_78;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "";
    }
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&local_80,0,pcVar3,(ulong)pcVar4);
    fout = local_58;
    this_01 = local_60;
    std::__cxx11::string::append((char *)&local_80);
    std::__cxx11::string::append((char *)&local_80);
    std::__cxx11::string::append((char *)&local_80);
  }
  else {
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&local_80,0,pcVar3,(ulong)pcVar4);
    pcVar2 = (this->super_cmGlobalGenerator).CMakeInstance;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"GHS_PRIMARY_TARGET","");
    cmake::MarkCliAsUsed(pcVar2,&local_a0);
    this_01 = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      this_01 = local_60;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(fout,"primaryTarget=",0xe);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(fout,local_80,(long)local_78);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"customization=",0xe);
  psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_01);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/CMakeFiles/custom_rule.bod",0x1b);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"customization=",0xe);
  psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_01);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (fout,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/CMakeFiles/custom_target.bod",0x1d);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  pcVar2 = (this->super_cmGlobalGenerator).CMakeInstance;
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"GHS_CUSTOMIZATION","");
  this_00 = (cmGlobalGhsMultiGenerator *)cmake::GetCacheDefinition(pcVar2,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((this_00 != (cmGlobalGhsMultiGenerator *)0x0) &&
     (*(char *)&(this_00->super_cmGlobalGenerator)._vptr_cmGlobalGenerator != '\0')) {
    std::__ostream_insert<char,std::char_traits<char>>(fout,"customization=",0xe);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar7 = strlen((char *)this_00);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,this_00,
               (char *)((long)&(this_00->super_cmGlobalGenerator)._vptr_cmGlobalGenerator + sVar7));
    TrimQuotes(&local_a0,this_00,&local_50);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (fout,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = (this->super_cmGlobalGenerator).CMakeInstance;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"GHS_CUSTOMIZATION","");
    cmake::MarkCliAsUsed(pcVar2,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteHighLevelDirectives(
  cmLocalGenerator* root, std::ostream& fout)
{
  /* set primary target */
  std::string tgt;
  const char* t =
    this->GetCMakeInstance()->GetCacheDefinition("GHS_PRIMARY_TARGET");
  if (t && *t != '\0') {
    tgt = t;
    this->GetCMakeInstance()->MarkCliAsUsed("GHS_PRIMARY_TARGET");
  } else {
    const char* a =
      this->GetCMakeInstance()->GetCacheDefinition("CMAKE_GENERATOR_PLATFORM");
    const char* p =
      this->GetCMakeInstance()->GetCacheDefinition("GHS_TARGET_PLATFORM");
    tgt = (a ? a : "");
    tgt += "_";
    tgt += (p ? p : "");
    tgt += ".tgt";
  }

  fout << "primaryTarget=" << tgt << std::endl;
  fout << "customization=" << root->GetBinaryDirectory()
       << "/CMakeFiles/custom_rule.bod" << std::endl;
  fout << "customization=" << root->GetBinaryDirectory()
       << "/CMakeFiles/custom_target.bod" << std::endl;

  char const* const customization =
    this->GetCMakeInstance()->GetCacheDefinition("GHS_CUSTOMIZATION");
  if (nullptr != customization && strlen(customization) > 0) {
    fout << "customization=" << this->TrimQuotes(customization) << std::endl;
    this->GetCMakeInstance()->MarkCliAsUsed("GHS_CUSTOMIZATION");
  }
}